

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

int av1_is_integer_mv(YV12_BUFFER_CONFIG *cur_picture,YV12_BUFFER_CONFIG *last_picture,
                     ForceIntegerMVInfo *force_intpel_info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  long in_RDX;
  long in_RSI;
  YV12_BUFFER_CONFIG *in_RDI;
  double dVar6;
  double cs_average;
  double cs_rate;
  int tmpX_1;
  int tmpY_1;
  int tmpX;
  int tmpY;
  uint16_t *p16_ref;
  uint16_t *p16_cur;
  int stride_ref;
  int stride_cur;
  uint8_t *p_ref;
  uint8_t *p_cur;
  int match;
  int y_pos;
  int x_pos;
  int j;
  int i;
  int pic_height;
  int pic_width;
  int S;
  int C;
  int T;
  int max_history_size;
  double threshold_average;
  double threshold_current;
  int block_size;
  int k;
  undefined4 local_b8;
  double local_b0;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  long local_90;
  long local_88;
  long local_78;
  uint8_t *local_70;
  int local_58;
  int local_54;
  int local_48;
  int local_44;
  int local_40;
  int local_24;
  int local_4;
  
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  iVar1 = (in_RDI->field_0).field_0.y_width;
  iVar2 = (in_RDI->field_1).field_0.y_height;
  for (local_54 = 0; local_54 + 8 <= iVar2; local_54 = local_54 + 8) {
    for (local_58 = 0; local_58 + 8 <= iVar1; local_58 = local_58 + 8) {
      bVar4 = true;
      local_40 = local_40 + 1;
      iVar5 = (in_RDI->field_4).field_0.y_stride;
      iVar3 = *(int *)(in_RSI + 0x20);
      local_70 = (in_RDI->field_5).buffers[0] + (local_54 * iVar5 + local_58);
      local_78 = *(long *)(in_RSI + 0x28) + (long)(local_54 * iVar3 + local_58);
      if ((in_RDI->flags & 8U) == 0) {
        for (local_9c = 0; local_9c < 8 && bVar4; local_9c = local_9c + 1) {
          for (local_a0 = 0; local_a0 < 8 && bVar4; local_a0 = local_a0 + 1) {
            if (local_70[local_a0] != *(uint8_t *)(local_78 + local_a0)) {
              bVar4 = false;
            }
          }
          local_70 = local_70 + iVar5;
          local_78 = local_78 + iVar3;
        }
      }
      else {
        local_88 = (long)local_70 * 2;
        local_90 = local_78 * 2;
        for (local_94 = 0; local_94 < 8 && bVar4; local_94 = local_94 + 1) {
          for (local_98 = 0; local_98 < 8 && bVar4; local_98 = local_98 + 1) {
            if (*(short *)(local_88 + (long)local_98 * 2) !=
                *(short *)(local_90 + (long)local_98 * 2)) {
              bVar4 = false;
            }
          }
          local_88 = local_88 + (long)iVar5 * 2;
          local_90 = local_90 + (long)iVar3 * 2;
        }
      }
      if (bVar4) {
        local_44 = local_44 + 1;
      }
      else {
        iVar5 = av1_hash_is_horizontal_perfect(in_RDI,8,local_58,local_54);
        if ((iVar5 != 0) ||
           (iVar5 = av1_hash_is_vertical_perfect(in_RDI,8,local_58,local_54), iVar5 != 0)) {
          local_48 = local_48 + 1;
        }
      }
    }
  }
  dVar6 = (double)(local_44 + local_48) / (double)local_40;
  *(double *)(in_RDX + (long)*(int *)(in_RDX + 0x100) * 8) = dVar6;
  *(int *)(in_RDX + 0x100) = (*(int *)(in_RDX + 0x100) + 1) % 0x20;
  *(int *)(in_RDX + 0x104) = *(int *)(in_RDX + 0x104) + 1;
  if (*(int *)(in_RDX + 0x104) < 0x20) {
    local_b8 = *(undefined4 *)(in_RDX + 0x104);
  }
  else {
    local_b8 = 0x20;
  }
  *(undefined4 *)(in_RDX + 0x104) = local_b8;
  if (0.8 <= dVar6) {
    if (local_44 == local_40) {
      local_4 = 1;
    }
    else {
      local_b0 = 0.0;
      for (local_24 = 0; local_24 < *(int *)(in_RDX + 0x104); local_24 = local_24 + 1) {
        local_b0 = *(double *)(in_RDX + (long)local_24 * 8) + local_b0;
      }
      local_b0 = local_b0 / (double)*(int *)(in_RDX + 0x104);
      if (0.95 <= local_b0) {
        if ((local_40 - local_44) - local_48 < 0) {
          local_4 = 1;
        }
        else if (local_b0 <= 1.01) {
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_is_integer_mv(const YV12_BUFFER_CONFIG *cur_picture,
                      const YV12_BUFFER_CONFIG *last_picture,
                      ForceIntegerMVInfo *const force_intpel_info) {
  // check use hash ME
  int k;

  const int block_size = FORCE_INT_MV_DECISION_BLOCK_SIZE;
  const double threshold_current = 0.8;
  const double threshold_average = 0.95;
  const int max_history_size = 32;
  int T = 0;  // total block
  int C = 0;  // match with collocated block
  int S = 0;  // smooth region but not match with collocated block

  const int pic_width = cur_picture->y_width;
  const int pic_height = cur_picture->y_height;
  for (int i = 0; i + block_size <= pic_height; i += block_size) {
    for (int j = 0; j + block_size <= pic_width; j += block_size) {
      const int x_pos = j;
      const int y_pos = i;
      int match = 1;
      T++;

      // check whether collocated block match with current
      uint8_t *p_cur = cur_picture->y_buffer;
      uint8_t *p_ref = last_picture->y_buffer;
      int stride_cur = cur_picture->y_stride;
      int stride_ref = last_picture->y_stride;
      p_cur += (y_pos * stride_cur + x_pos);
      p_ref += (y_pos * stride_ref + x_pos);

      if (cur_picture->flags & YV12_FLAG_HIGHBITDEPTH) {
        uint16_t *p16_cur = CONVERT_TO_SHORTPTR(p_cur);
        uint16_t *p16_ref = CONVERT_TO_SHORTPTR(p_ref);
        for (int tmpY = 0; tmpY < block_size && match; tmpY++) {
          for (int tmpX = 0; tmpX < block_size && match; tmpX++) {
            if (p16_cur[tmpX] != p16_ref[tmpX]) {
              match = 0;
            }
          }
          p16_cur += stride_cur;
          p16_ref += stride_ref;
        }
      } else {
        for (int tmpY = 0; tmpY < block_size && match; tmpY++) {
          for (int tmpX = 0; tmpX < block_size && match; tmpX++) {
            if (p_cur[tmpX] != p_ref[tmpX]) {
              match = 0;
            }
          }
          p_cur += stride_cur;
          p_ref += stride_ref;
        }
      }

      if (match) {
        C++;
        continue;
      }

      if (av1_hash_is_horizontal_perfect(cur_picture, block_size, x_pos,
                                         y_pos) ||
          av1_hash_is_vertical_perfect(cur_picture, block_size, x_pos, y_pos)) {
        S++;
        continue;
      }
    }
  }

  assert(T > 0);
  double cs_rate = ((double)(C + S)) / ((double)(T));

  force_intpel_info->cs_rate_array[force_intpel_info->rate_index] = cs_rate;

  force_intpel_info->rate_index =
      (force_intpel_info->rate_index + 1) % max_history_size;
  force_intpel_info->rate_size++;
  force_intpel_info->rate_size =
      AOMMIN(force_intpel_info->rate_size, max_history_size);

  if (cs_rate < threshold_current) {
    return 0;
  }

  if (C == T) {
    return 1;
  }

  double cs_average = 0.0;

  for (k = 0; k < force_intpel_info->rate_size; k++) {
    cs_average += force_intpel_info->cs_rate_array[k];
  }
  cs_average /= force_intpel_info->rate_size;

  if (cs_average < threshold_average) {
    return 0;
  }

  if ((T - C - S) < 0) {
    return 1;
  }

  if (cs_average > 1.01) {
    return 1;
  }

  return 0;
}